

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

double activityContributionMax(double coef,double *lb,double *ub)

{
  double dVar1;
  
  if (0.0 <= coef) {
    dVar1 = INFINITY;
    if (*ub < INFINITY) {
      dVar1 = *ub * coef;
    }
  }
  else if (-INFINITY < *lb) {
    dVar1 = *lb * coef;
  }
  else {
    dVar1 = INFINITY;
  }
  return dVar1;
}

Assistant:

static double activityContributionMax(double coef, const double& lb,
                                      const double& ub) {
  if (coef < 0) {
    if (lb == -kHighsInf) return kHighsInf;

    return coef * lb;
  } else {
    if (ub == kHighsInf) return kHighsInf;

    return coef * ub;
  }
}